

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O2

void __thiscall agge::tests::MiscTests::AddingVectorToAPointShiftsIt(MiscTests *this)

{
  allocator local_61;
  point<float> local_60;
  point<float> local_58;
  string local_50;
  LocationInfo local_30;
  
  local_58.x = -0.50200003;
  local_58.y = 363.6;
  local_60.x = -0.50200003;
  local_60.y = 363.6;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x72);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_58,&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.x = 6.4979997;
  local_58.y = 317.6;
  local_60.x = 6.4979997;
  local_60.y = 317.6;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x73);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_58,&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.x = 71.899994;
  local_58.y = 40.31;
  local_60.x = 71.899994;
  local_60.y = 40.31;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x74);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_58,&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.x = 78.899994;
  local_58.y = -5.6900005;
  local_60.x = 78.899994;
  local_60.y = -5.6900005;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x75);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_58,&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.x = 1.00893e-43;
  local_58.y = -NAN;
  local_60.x = 1.00893e-43;
  local_60.y = -NAN;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x77);
  ut::are_equal<agge::point<int>,agge::point<int>>
            ((point<int> *)&local_58,(point<int> *)&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.x = -NAN;
  local_58.y = 4.48416e-44;
  local_60.x = -NAN;
  local_60.y = 4.48416e-44;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x78);
  ut::are_equal<agge::point<int>,agge::point<int>>
            ((point<int> *)&local_58,(point<int> *)&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.x = 1.39009e-42;
  local_58.y = 2.53215e-42;
  local_60.x = 1.39009e-42;
  local_60.y = 2.53215e-42;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x79);
  ut::are_equal<agge::point<int>,agge::point<int>>
            ((point<int> *)&local_58,(point<int> *)&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.x = 1.26677e-42;
  local_58.y = 2.79839e-42;
  local_60.x = 1.26677e-42;
  local_60.y = 2.79839e-42;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x7a);
  ut::are_equal<agge::point<int>,agge::point<int>>
            ((point<int> *)&local_58,(point<int> *)&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( AddingVectorToAPointShiftsIt )
			{
				// INIT
				const point_r p1 = { -1.202f, 311.9f }, p2 = { 71.2f, -11.39f };
				const point<int> p3 = { -9, 13 }, p4 = { 911, 1978 };
				const vector_r v1 = { 0.7f, 51.7f }, v2 = { 7.7f, 5.7f };
				const agge_vector<int> v3 = { 81, -171 }, v4 = { -7, 19 };

				// ACT / ASSERT
				assert_equal(create_point(-1.202f + 0.7f, 311.9f + 51.7f), p1 + v1);
				assert_equal(create_point(-1.202f + 7.7f, 311.9f + 5.7f), p1 + v2);
				assert_equal(create_point(71.2f + 0.7f, -11.39f + 51.7f), p2 + v1);
				assert_equal(create_point(71.2f + 7.7f, -11.39f + 5.7f), p2 + v2);

				assert_equal(create_point(-9 + 81, 13 + -171), p3 + v3);
				assert_equal(create_point(-9 + -7, 13 + 19), p3 + v4);
				assert_equal(create_point(911 + 81, 1978 + -171), p4 + v3);
				assert_equal(create_point(911 + -7, 1978 + 19), p4 + v4);
			}